

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_WriteCountExpr_Test::TestBody(ExprWriterTest_WriteCountExpr_Test *this)

{
  NumericExpr lhs;
  bool bVar1;
  CStringRef arg0;
  AssertHelper *this_00;
  long in_RDI;
  ExprBase other;
  AssertionResult gtest_ar;
  LogicalExpr args [3];
  ExprWriterTest *in_stack_fffffffffffffec8;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined4 in_stack_fffffffffffffee8;
  int line;
  char *file;
  Type type;
  AssertHelper *this_01;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_ffffffffffffff20;
  ExprWriterTest *in_stack_ffffffffffffff28;
  AssertHelper local_d0 [3];
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  BasicCStringRef<char> local_98;
  string local_90 [32];
  AssertionResult local_70;
  undefined8 local_60;
  undefined8 local_58;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_50;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_40;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> local_30;
  char local_28 [40];
  
  other.impl_ = (Impl *)(in_RDI + 0x10);
  line = 0;
  local_40.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffec8,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),(Reference)other.impl_,
             (type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  local_50.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffec8,5.71629011581864e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  lhs.super_ExprBase.impl_._4_4_ = line;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffee8;
  local_30.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeRelational
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                  (Kind)((ulong)in_stack_fffffffffffffed0 >> 0x20),lhs,(NumericExpr)other.impl_);
  file = local_28;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  local_58 = *(undefined8 *)(in_RDI + 0x50);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (LogicalConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  local_60 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (LogicalConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  type = (Type)((ulong)in_RDI >> 0x20);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_98,"{}");
  this_01 = local_d0;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>::ArrayRef<3ul>
            (in_stack_fffffffffffffed0,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> (*) [3])in_stack_fffffffffffffec8);
  arg0.data_ = (char *)ExprWriterTest::MakeCount
                                 (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_01);
  testing::internal::EqHelper<false>::Compare<char[20],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffee8),(char *)other.impl_,
             (char (*) [20])CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_90);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x11a8fe);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11a986)
    ;
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x11a9d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11aa17);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteCountExpr) {
  LogicalExpr args[] = {
    MakeRelational(ex::EQ, MakeVariable(0), MakeConst(0)), l1, l0
  };
  CHECK_WRITE("count(x1 = 0, 1, 0)", MakeCount(args));
}